

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

routine_t cs_impl::fiber::create(context_t *cxt,function<void_()> *f)

{
  vector<cs_impl::fiber::Routine*,std::allocator<cs_impl::fiber::Routine*>> *this;
  long *plVar1;
  _Manager_type p_Var2;
  long lVar3;
  void *pvVar4;
  iterator __position;
  Routine *pRVar5;
  routine_t rVar6;
  long *in_FS_OFFSET;
  Routine *routine;
  Routine *local_50;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type local_30;
  
  pRVar5 = (Routine *)operator_new(0x438);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_38 = (_Manager_type)0x0;
  local_30 = f->_M_invoker;
  p_Var2 = (f->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_48._M_unused._0_8_ = (undefined8)*(undefined8 *)&(f->super__Function_base)._M_functor;
    local_48._8_8_ = *(undefined8 *)((long)&(f->super__Function_base)._M_functor + 8);
    (f->super__Function_base)._M_manager = (_Manager_type)0x0;
    f->_M_invoker = (_Invoker_type)0x0;
    local_38 = p_Var2;
  }
  Routine::Routine(pRVar5,cxt,(function<void_()> *)&local_48);
  if (local_38 != (_Manager_type)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  lVar3 = *in_FS_OFFSET;
  local_50 = pRVar5;
  if (*(char *)(lVar3 + -8) == '\0') {
    *(undefined1 *)(lVar3 + -8) = 1;
    __cxx_global_var_init_7();
  }
  this = (vector<cs_impl::fiber::Routine*,std::allocator<cs_impl::fiber::Routine*>> *)
         (lVar3 + -0x410);
  plVar1 = (long *)(lVar3 + -0x3f8);
  if ((long *)*plVar1 == plVar1) {
    if (*(char *)(lVar3 + -8) == '\0') {
      *(undefined1 *)(lVar3 + -8) = 1;
      __cxx_global_var_init_7();
    }
    __position._M_current = *(Routine ***)(lVar3 + -0x408);
    if (__position._M_current == *(Routine ***)(lVar3 + -0x400)) {
      std::vector<cs_impl::fiber::Routine*,std::allocator<cs_impl::fiber::Routine*>>::
      _M_realloc_insert<cs_impl::fiber::Routine*const&>(this,__position,&local_50);
    }
    else {
      *__position._M_current = local_50;
      *(long *)(lVar3 + -0x408) = *(long *)(lVar3 + -0x408) + 8;
    }
    if (*(char *)(lVar3 + -8) == '\0') {
      *(undefined1 *)(lVar3 + -8) = 1;
      __cxx_global_var_init_7();
    }
    rVar6 = (routine_t)((ulong)(*(long *)(lVar3 + -0x408) - *(long *)this) >> 3);
  }
  else {
    if (*(char *)(lVar3 + -8) == '\0') {
      *(undefined1 *)(lVar3 + -8) = 1;
      __cxx_global_var_init_7();
    }
    rVar6 = *(routine_t *)(*plVar1 + 0x10);
    if (*(char *)(lVar3 + -8) == '\0') {
      *(undefined1 *)(lVar3 + -8) = 1;
      __cxx_global_var_init_7();
    }
    pvVar4 = *(void **)(lVar3 + -0x3f8);
    *(long *)(lVar3 + -1000) = *(long *)(lVar3 + -1000) + -1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(pvVar4,0x18);
    if (*(char *)(lVar3 + -8) == '\0') {
      *(undefined1 *)(lVar3 + -8) = 1;
      __cxx_global_var_init_7();
    }
    pRVar5 = local_50;
    if (*(long *)(*(long *)this + (ulong)(rVar6 - 1) * 8) != 0) {
      __assert_fail("ordinator.routines[id - 1] == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/system/./unix/common.cpp"
                    ,0x137,
                    "routine_t cs_impl::fiber::create(const cs::context_t &, std::function<void ()>)"
                   );
    }
    if (*(char *)(lVar3 + -8) == '\0') {
      *(undefined1 *)(lVar3 + -8) = 1;
      __cxx_global_var_init_7();
    }
    *(Routine **)(*(long *)this + (ulong)(rVar6 - 1) * 8) = pRVar5;
  }
  return rVar6;
}

Assistant:

routine_t create(const cs::context_t &cxt, std::function<void()> f)
		{
			Routine *routine = new Routine(cxt, std::move(f));

			if (ordinator.indexes.empty()) {
				ordinator.routines.push_back(routine);
				return ordinator.routines.size();
			}
			else {
				routine_t id = ordinator.indexes.front();
				ordinator.indexes.pop_front();
				assert(ordinator.routines[id - 1] == nullptr);
				ordinator.routines[id - 1] = routine;
				return id;
			}
		}